

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O2

Vec_Wec_t * Gia_Iso4Gia(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar4;
  int i;
  int i_00;
  int RandC [2];
  
  p_00 = Gia_ManLevelizeR(p);
  Abc_Random(1);
  i = 0;
  do {
    if (p_00->nSize <= i) {
      return p_00;
    }
    p_01 = Vec_WecEntry(p_00,i);
    RandC[0] = Abc_Random(0);
    RandC[1] = Abc_Random(0);
    i_00 = 0;
    if (i == 0) {
      for (; i_00 < p_01->nSize; i_00 = i_00 + 1) {
        iVar2 = Vec_IntEntry(p_01,i_00);
        pGVar4 = Gia_ManObj(p,iVar2);
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        if ((-1 < (int)(uint)*(undefined8 *)pGVar4) ||
           (((uint)*(undefined8 *)pGVar4 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso3.c"
                        ,0xb9,"Vec_Wec_t *Gia_Iso4Gia(Gia_Man_t *)");
        }
        uVar3 = Abc_Random(0);
        pGVar4->Value = uVar3;
        pGVar4[-(ulong)((uint)*(ulong *)pGVar4 & 0x1fffffff)].Value =
             pGVar4[-(ulong)((uint)*(ulong *)pGVar4 & 0x1fffffff)].Value +
             uVar3 + *(int *)((long)RandC + (ulong)((uint)(*(ulong *)pGVar4 >> 0x1b) & 4));
      }
    }
    else {
      for (; i_00 < p_01->nSize; i_00 = i_00 + 1) {
        iVar2 = Vec_IntEntry(p_01,i_00);
        pGVar4 = Gia_ManObj(p,iVar2);
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar1 = *(ulong *)pGVar4;
        if ((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) {
          pGVar4[-(uVar1 & 0x1fffffff)].Value =
               pGVar4[-(uVar1 & 0x1fffffff)].Value +
               *(int *)((long)RandC + (ulong)((uint)(uVar1 >> 0x1b) & 4)) + pGVar4->Value;
          uVar3 = (uint)(uVar1 >> 0x20);
          pGVar4[-(ulong)(uVar3 & 0x1fffffff)].Value =
               pGVar4[-(ulong)(uVar3 & 0x1fffffff)].Value + RandC[uVar3 >> 0x1d & 1] + pGVar4->Value
          ;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_Iso4Gia( Gia_Man_t * p )
{
    Vec_Wec_t * vLevs = Gia_ManLevelizeR( p );
    Vec_Int_t * vLevel; int l;
    Abc_Random( 1 );
    Vec_WecForEachLevel( vLevs, vLevel, l )
    {
        Gia_Obj_t * pObj;  int i;
        int RandC[2] = { Abc_Random(0), Abc_Random(0) };
        if ( l == 0 )
        {
            Gia_ManForEachObjVec( vLevel, p, pObj, i )
            {
                assert( Gia_ObjIsCo(pObj) );
                pObj->Value = Abc_Random(0);
                Gia_ObjFanin0(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC0(pObj)];
            }
        }
        else 
        {
            Gia_ManForEachObjVec( vLevel, p, pObj, i ) if ( Gia_ObjIsAnd(pObj) )
            {
                Gia_ObjFanin0(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC0(pObj)];
                Gia_ObjFanin1(pObj)->Value += pObj->Value + RandC[Gia_ObjFaninC1(pObj)];
            }
        }
    }
    return vLevs;
}